

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O2

void Sdm_ManReadCnfCosts(Sdm_Man_t *p,int *pCosts,int nCosts)

{
  Sdm_Dsd_t *pSVar1;
  long lVar2;
  
  if (nCosts == 0x253) {
    pCosts[0] = 0;
    pCosts[1] = 0;
    pSVar1 = p->pDsd6;
    for (lVar2 = 0; lVar2 != 0x944; lVar2 = lVar2 + 4) {
      *(int *)((long)pCosts + lVar2 + 8) = (&pSVar1[2].nClauses)[lVar2 * 2];
    }
    return;
  }
  __assert_fail("nCosts == DSD_CLASS_NUM",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/extra/extraUtilDsd.c"
                ,0x3fc,"void Sdm_ManReadCnfCosts(Sdm_Man_t *, int *, int)");
}

Assistant:

void Sdm_ManReadCnfCosts( Sdm_Man_t * p, int * pCosts, int nCosts )
{
    int i;
    assert( nCosts == DSD_CLASS_NUM );
    pCosts[0] = pCosts[1] = 0;
    for ( i = 2; i < DSD_CLASS_NUM; i++ )
        pCosts[i] = Sdm_ManReadDsdClauseNum( p, i );
}